

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::emit_block_hints(CompilerGLSL *this,SPIRBlock *block)

{
  char *pcVar1;
  uint uVar2;
  allocator local_29;
  string local_28;
  
  uVar2 = 0x8b;
  if ((this->options).es != false) {
    uVar2 = 0x135;
  }
  if ((this->options).version <= uVar2) {
    return;
  }
  switch(block->hint) {
  case HintUnroll:
    ::std::__cxx11::string::string((string *)&local_28,"GL_EXT_control_flow_attributes",&local_29);
    require_extension_internal(this,&local_28);
    ::std::__cxx11::string::~string((string *)&local_28);
    pcVar1 = "#define SPIRV_CROSS_UNROLL";
    goto LAB_0030125a;
  case HintDontUnroll:
    ::std::__cxx11::string::string((string *)&local_28,"GL_EXT_control_flow_attributes",&local_29);
    require_extension_internal(this,&local_28);
    ::std::__cxx11::string::~string((string *)&local_28);
    statement<char_const(&)[17]>(this,(char (*) [17])0x3a1878);
    break;
  case HintFlatten:
    ::std::__cxx11::string::string((string *)&local_28,"GL_EXT_control_flow_attributes",&local_29);
    require_extension_internal(this,&local_28);
    ::std::__cxx11::string::~string((string *)&local_28);
    statement<char_const(&)[20]>(this,(char (*) [20])0x3a1826);
    break;
  case HintDontFlatten:
    ::std::__cxx11::string::string((string *)&local_28,"GL_EXT_control_flow_attributes",&local_29);
    require_extension_internal(this,&local_28);
    ::std::__cxx11::string::~string((string *)&local_28);
    pcVar1 = "#define SPIRV_CROSS_BRANCH";
LAB_0030125a:
    statement<char_const(&)[19]>(this,(char (*) [19])(pcVar1 + 8));
  }
  return;
}

Assistant:

void CompilerGLSL::emit_block_hints(const SPIRBlock &block)
{
	if ((options.es && options.version < 310) || (!options.es && options.version < 140))
		return;

	switch (block.hint)
	{
	case SPIRBlock::HintFlatten:
		require_extension_internal("GL_EXT_control_flow_attributes");
		statement("SPIRV_CROSS_FLATTEN");
		break;
	case SPIRBlock::HintDontFlatten:
		require_extension_internal("GL_EXT_control_flow_attributes");
		statement("SPIRV_CROSS_BRANCH");
		break;
	case SPIRBlock::HintUnroll:
		require_extension_internal("GL_EXT_control_flow_attributes");
		statement("SPIRV_CROSS_UNROLL");
		break;
	case SPIRBlock::HintDontUnroll:
		require_extension_internal("GL_EXT_control_flow_attributes");
		statement("SPIRV_CROSS_LOOP");
		break;
	default:
		break;
	}
}